

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O1

bool __thiscall
SListBase<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount>::Prepend
          (SListBase<Js::PolymorphicInlineCacheInfo_*,_Memory::Recycler,_RealCount> *this,
          Recycler *allocator,PolymorphicInlineCacheInfo **data)

{
  PolymorphicInlineCacheInfo *pPVar1;
  SListNodeBase<Memory::Recycler> *pSVar2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  Recycler *this_00;
  undefined4 *puVar6;
  SListNodeBase<Memory::Recycler> *addr;
  undefined1 local_50 [8];
  TrackAllocData data_1;
  
  local_50 = (undefined1  [8])&SListNode<Js::PolymorphicInlineCacheInfo*,Memory::Recycler>::typeinfo
  ;
  data_1.typeinfo = (type_info *)0x0;
  data_1.plusSize = 0xffffffffffffffff;
  data_1.count = (size_t)anon_var_dwarf_1258d2;
  data_1.filename._0_4_ = 0x13b;
  this_00 = Memory::Recycler::TrackAllocInfo(allocator,(TrackAllocData *)local_50);
  BVar5 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar5 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x1ef,"(ExceptionCheck::CanHandleOutOfMemory())",
                       "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar4) goto LAB_00789e4d;
    *puVar6 = 0;
  }
  addr = (SListNodeBase<Memory::Recycler> *)
         Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                   (this_00,0x10);
  if (addr == (SListNodeBase<Memory::Recycler> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x1f2,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar4) {
LAB_00789e4d:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  (addr->next).ptr = (SListNodeBase<Memory::Recycler> *)0x0;
  pPVar1 = *data;
  Memory::Recycler::WBSetBit((char *)(addr + 1));
  addr[1].next.ptr = (SListNodeBase<Memory::Recycler> *)pPVar1;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr + 1);
  pSVar2 = (this->super_SListNodeBase<Memory::Recycler>).next.ptr;
  Memory::Recycler::WBSetBit((char *)addr);
  (addr->next).ptr = pSVar2;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  Memory::Recycler::WBSetBit((char *)this);
  (this->super_SListNodeBase<Memory::Recycler>).next.ptr = addr;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(this);
  (this->super_RealCount).count = (this->super_RealCount).count + 1;
  return true;
}

Assistant:

bool Prepend(TAllocator * allocator, TData const& data)
    {
        Node * newNode = AllocatorNew(TAllocator, allocator, Node, data);
        if (newNode)
        {
            newNode->Next() = this->Next();
            this->Next() = newNode;
            this->IncrementCount();
            return true;
        }
        return false;
    }